

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_createv(ucvector *out,size_t length,char *type,uchar *data)

{
  void *in_RCX;
  ucvector *in_RDX;
  uchar **in_RSI;
  uint error;
  uchar *chunk;
  uchar *in_stack_ffffffffffffffd0;
  uint local_4;
  
  local_4 = lodepng_chunk_init(in_RSI,in_RDX,(size_t)in_RCX,(char *)in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    lodepng_memcpy(in_stack_ffffffffffffffd0 + 8,in_RCX,(size_t)in_RSI);
    lodepng_chunk_generate_crc(in_stack_ffffffffffffffd0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned lodepng_chunk_createv(ucvector* out,
                                      size_t length, const char* type, const unsigned char* data) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, length, type));

  /*3: the data*/
  lodepng_memcpy(chunk + 8, data, length);

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}